

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O1

ErrorType __thiscall
Network::Client::ImplBase<Network::Client::MQTTv5::Impl>::prepareSAR
          (ImplBase<Network::Client::MQTTv5::Impl> *this,ControlPacketSerializable *packet,
          bool withAnswer,bool isPublish)

{
  byte bVar1;
  _func_int *p_Var2;
  PacketStorage *pPVar3;
  PropertyBase *pPVar4;
  code *pcVar5;
  uint packetSize;
  uint uVar6;
  int iVar7;
  ErrorType EVar8;
  undefined1 *buffer;
  ulong uVar9;
  ulong uVar10;
  undefined1 *puVar11;
  uint uVar12;
  undefined **ppuVar13;
  undefined1 auStack_128 [8];
  undefined **local_120;
  PublishPacket publish;
  
  puVar11 = auStack_128;
  packetSize = (*(packet->super_Serializable)._vptr_Serializable[3])(packet,1);
  uVar9 = (ulong)packetSize;
  if (packetSize < 0x201) {
    puVar11 = auStack_128 + -(uVar9 + 0xf & 0xfffffffffffffff0);
    buffer = puVar11;
  }
  else {
    buffer = (undefined1 *)malloc(uVar9);
  }
  uVar10 = -uVar9;
  if (0x200 < packetSize) {
    uVar10 = uVar9;
  }
  p_Var2 = (packet->super_Serializable)._vptr_Serializable[1];
  *(undefined8 *)(puVar11 + -8) = 0x11ea47;
  uVar6 = (*p_Var2)(packet);
  EVar8.errorCode = -1;
  if (uVar6 != packetSize) goto LAB_0011ed65;
  if (isPublish) {
    publish.super_ControlPacketSerializableImpl.super_ControlPacketSerializable.super_Serializable.
    _vptr_Serializable = (Serializable)packet[1].super_Serializable._vptr_Serializable;
    publish.super_ControlPacketSerializableImpl.header = (FixedHeaderBase *)&PTR_getSize_00131a40;
    publish.super_ControlPacketSerializableImpl.remLength.super_Serializable._vptr_Serializable.
    _0_4_ = *(undefined4 *)&packet[3].super_Serializable._vptr_Serializable;
    publish.super_ControlPacketSerializableImpl.remLength.super_Serializable._vptr_Serializable.
    _4_2_ = *(undefined2 *)((long)&packet[3].super_Serializable._vptr_Serializable + 4);
    publish.super_ControlPacketSerializableImpl.remLength.field_0 =
         *(anon_union_4_2_f99d0578_for_VBInt_1 *)(packet + 4);
    publish.super_ControlPacketSerializableImpl.remLength._12_4_ =
         *(undefined4 *)((long)&packet[4].super_Serializable._vptr_Serializable + 4);
    publish.super_ControlPacketSerializableImpl.fixedVariableHeader._0_4_ =
         *(undefined4 *)&packet[5].super_Serializable._vptr_Serializable;
    publish.super_ControlPacketSerializableImpl.fixedVariableHeader._4_4_ =
         *(undefined4 *)((long)&packet[5].super_Serializable._vptr_Serializable + 4);
    publish.super_ControlPacketSerializableImpl.props =
         (SerializableProperties *)packet[6].super_Serializable._vptr_Serializable;
    local_120 = &PTR_getSize_00132530;
    bVar1 = *(byte *)&packet[8].super_Serializable._vptr_Serializable;
    publish.header.super_FixedHeaderBase._vptr_FixedHeaderBase._0_1_ = bVar1;
    publish.super_ControlPacketSerializableImpl.payload =
         (SerializablePayload *)&PTR_getType_00132578;
    publish.fixedVariableHeader.super_FixedFieldGeneric.value =
         (GenericTypeBase *)&PTR_getSize_00131a80;
    publish.fixedVariableHeader.super_TopicAndID.topicName.super_Serializable._vptr_Serializable =
         (_func_int **)&PTR_acceptBuffer_00131ab8;
    publish.fixedVariableHeader.super_TopicAndID.topicName.
    super_SerializableVisitor<Protocol::MQTT::Common::DynamicStringView>.super_MemMappedVisitor.
    _vptr_MemMappedVisitor = (MemMappedVisitor)packet[0xd].super_Serializable._vptr_Serializable;
    publish.fixedVariableHeader.super_TopicAndID.topicName.length =
         *(uint16 *)&packet[0xe].super_Serializable._vptr_Serializable;
    publish.fixedVariableHeader.super_TopicAndID.topicName.data._0_2_ =
         *(ushort *)((long)&packet[0xe].super_Serializable._vptr_Serializable + 2);
    uVar9 = (ulong)(ushort)publish.fixedVariableHeader.super_TopicAndID.topicName.data;
    publish.fixedVariableHeader.super_FixedFieldGeneric.super_Serializable._vptr_Serializable =
         packet[10].super_Serializable._vptr_Serializable;
    publish._64_8_ = &PTR_getSize_001325b0;
    publish.fixedVariableHeader._40_8_ = &PTR_typeSize_00132630;
    publish.fixedVariableHeader._v.super_GenericTypeBase._vptr_GenericTypeBase =
         packet[0x10].super_Serializable._vptr_Serializable;
    publish.fixedVariableHeader._v.value =
         (TopicAndID *)packet[0x11].super_Serializable._vptr_Serializable;
    publish.fixedVariableHeader.flags = "V\x11\x12";
    publish.props.super_SerializableProperties.super_Serializable._vptr_Serializable =
         (Serializable)&PTR_getSize_00131a40;
    publish.props.length.super_Serializable._vptr_Serializable._0_4_ =
         *(undefined4 *)&packet[0x14].super_Serializable._vptr_Serializable;
    publish.props.length.super_Serializable._vptr_Serializable._4_2_ =
         *(undefined2 *)((long)&packet[0x14].super_Serializable._vptr_Serializable + 4);
    publish.props.length._8_8_ = packet[0x15].super_Serializable._vptr_Serializable;
    ppuVar13 = &PTR_getSize_00131bf8;
    publish.props.reference = (PropertyBase *)&PTR_getSize_00131bf8;
    publish.payload.super_SerializablePayload.super_EmptySerializable.super_Serializable.
    _vptr_Serializable = (EmptySerializable)packet[0x18].super_Serializable._vptr_Serializable;
    publish.payload.data._0_4_ = *(undefined4 *)&packet[0x19].super_Serializable._vptr_Serializable;
    uVar6 = (bVar1 & 6) >> 1;
    publish.props.head = (PropertyBase *)publish.props.length._8_8_;
    if (uVar6 != 0) {
      publish.payload._16_8_ = &PTR_getSize_00131bf8;
      pPVar3 = this->storage;
      uVar12 = (uint)(ushort)publish.fixedVariableHeader.super_TopicAndID.topicName.data;
      p_Var2 = *pPVar3->_vptr_PacketStorage;
      *(undefined8 *)(puVar11 + -8) = 0x11ec29;
      iVar7 = (*p_Var2)(pPVar3,uVar9,buffer);
      if ((char)iVar7 == '\0') {
LAB_0011ed1b:
        publish.props.reference = (PropertyBase *)publish.payload._16_8_;
        publish.payload.super_SerializablePayload.super_EmptySerializable.super_Serializable.
        _vptr_Serializable = (EmptySerializable)(Serializable)0x0;
        publish.payload.data._0_4_ = 0;
        if ((publish.props.length._8_8_ != 0) &&
           ((PropertyBase *)publish.props.length._8_8_ != publish.props.head)) {
          do {
            pPVar4 = *(PropertyBase **)(publish.props.length._8_8_ + 0x10);
            if (*(char *)(publish.props.length._8_8_ + 0x18) == '\x01') {
              pcVar5 = *(code **)(*(long *)publish.props.length._8_8_ + 0x30);
              *(undefined8 *)(puVar11 + -8) = 0x11ed4d;
              (*pcVar5)();
            }
            publish.props.length._8_8_ = pPVar4;
          } while ((pPVar4 != (PropertyBase *)0x0) && (pPVar4 != publish.props.head));
        }
        EVar8.errorCode = -10;
        goto LAB_0011ed65;
      }
      ppuVar13 = (undefined **)publish.payload._16_8_;
      if (uVar6 == 2) {
        bVar1 = (this->buffers).maxID;
        if ((ulong)bVar1 == 0) {
          uVar9 = 0;
        }
        else {
          uVar9 = 0;
          do {
            if ((*(uint *)((this->buffers).buffer + uVar9 * 4) & 0x1ffff) == 0) goto LAB_0011eca8;
            uVar9 = uVar9 + 1;
          } while (bVar1 != uVar9);
          uVar9 = (ulong)bVar1;
        }
LAB_0011eca8:
        if (bVar1 <= (byte)uVar9) goto LAB_0011ed1b;
        *(uint *)((this->buffers).buffer + (uVar9 & 0xff) * 4) = uVar12 | 0x80000000;
      }
      else if (uVar6 == 1) {
        bVar1 = (this->buffers).maxID;
        if ((ulong)bVar1 == 0) {
          uVar9 = 0;
        }
        else {
          uVar9 = 0;
          do {
            if ((*(uint *)((this->buffers).buffer + uVar9 * 4) & 0x1ffff) == 0) goto LAB_0011ec68;
            uVar9 = uVar9 + 1;
          } while (bVar1 != uVar9);
          uVar9 = (ulong)bVar1;
        }
LAB_0011ec68:
        if (bVar1 <= (byte)uVar9) goto LAB_0011ed1b;
        *(uint *)((this->buffers).buffer + (uVar9 & 0xff) * 4) = uVar12;
      }
    }
    publish.payload.super_SerializablePayload.super_EmptySerializable.super_Serializable.
    _vptr_Serializable = (EmptySerializable)(Serializable)0x0;
    publish.payload.data._0_4_ = 0;
    publish.props.reference = (PropertyBase *)ppuVar13;
    if ((publish.props.length._8_8_ != 0) &&
       ((PropertyBase *)publish.props.length._8_8_ != publish.props.head)) {
      do {
        pPVar4 = *(PropertyBase **)(publish.props.length._8_8_ + 0x10);
        if (*(char *)(publish.props.length._8_8_ + 0x18) == '\x01') {
          pcVar5 = *(code **)(*(long *)publish.props.length._8_8_ + 0x30);
          *(undefined8 *)(puVar11 + -8) = 0x11ecf0;
          (*pcVar5)();
        }
        publish.props.length._8_8_ = pPVar4;
      } while ((pPVar4 != (PropertyBase *)0x0) && (pPVar4 != publish.props.head));
    }
  }
  *(undefined8 *)(puVar11 + -8) = 0x11ed16;
  EVar8 = sendAndReceive(this,buffer,packetSize,withAnswer);
LAB_0011ed65:
  if (0 < (long)uVar10) {
    *(undefined8 *)(puVar11 + -8) = 0x11ed73;
    free(buffer);
  }
  return (ErrorType)EVar8.errorCode;
}

Assistant:

ErrorType prepareSAR(Protocol::MQTT::V5::ControlPacketSerializable & packet, bool withAnswer = true, bool isPublish = false)
        {
            // Ok, setting are done, let's build this packet now
            uint32 packetSize = packet.computePacketSize();
            DeclareStackHeapBuffer(buffer, packetSize, StackSizeAllocationLimit);
            if (packet.copyInto(buffer) != packetSize)
                return ErrorType::UnknownError;

#if MQTTQoSSupportLevel == -1
#else
            // Check for saving publish packet if required
            if (isPublish)
            {
                Protocol::MQTT::V5::PublishPacket publish = (Protocol::MQTT::V5::PublishPacket&)packet;
                uint8 QoS = publish.header.getQoS();
                if (QoS > 0) {
                    uint16 packetID = publish.fixedVariableHeader.packetID;
  #if MQTTQoSSupportLevel == 1
                    // Save packet
                    if (!storage->savePacketBuffer(packetID, buffer, packetSize))
                        return ErrorType::StorageError;
  #endif
                    // Save packet ID too
                    if ((QoS == 1 && !buffers.storeQoS1ID(packetID)) || (QoS == 2 && !buffers.storeQoS2ID(packetID)))
                        return ErrorType::StorageError;
                }
            }
#endif

    #if MQTTDumpCommunication == 1
    //      String out;
    //      packet.dump(out, 2);
    //      printf("Prepared:\n%s\n", (const char*)out);
    #endif
            return sendAndReceive(buffer, packetSize, withAnswer);
        }